

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase399::run(TestCase399 *this)

{
  return;
}

Assistant:

TEST(WireFormat, NanPatching) {
  EXPECT_EQ(0x7fc00000u, mask(kj::nan(), 0));
  EXPECT_TRUE(isNan(unmask<float>(0x7fc00000u, 0)));
  EXPECT_TRUE(isNan(unmask<float>(0x7fc00001u, 0)));
  EXPECT_TRUE(isNan(unmask<float>(0x7fc00005u, 0)));
  EXPECT_EQ(0x7fc00000u, mask(unmask<float>(0x7fc00000u, 0), 0));
  EXPECT_EQ(0x7ff8000000000000ull, mask((double)kj::nan(), 0));
  EXPECT_TRUE(isNan(unmask<double>(0x7ff8000000000000ull, 0)));
  EXPECT_TRUE(isNan(unmask<double>(0x7ff8000000000001ull, 0)));
  EXPECT_TRUE(isNan(unmask<double>(0x7ff8000000000005ull, 0)));
  EXPECT_EQ(0x7ff8000000000000ull, mask(unmask<double>(0x7ff8000000000000ull, 0), 0));
}